

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::Text::toString_abi_cxx11_(string *__return_storage_ptr__,Text *this,Layout *layout)

{
  ostream *poVar1;
  stringstream ss;
  allocator local_35e;
  allocator local_35d;
  allocator local_35c;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  double local_358;
  double local_350;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::string::string((string *)&local_1e8,"text",&local_359);
  elemStart(&local_1c8,&local_1e8);
  poVar1 = std::operator<<(local_198,(string *)&local_1c8);
  std::__cxx11::string::string((string *)&local_228,"x",&local_35a);
  local_350 = translateX((this->origin).x,layout);
  std::__cxx11::string::string((string *)&local_248,"",&local_35b);
  attribute<double>(&local_208,&local_228,&local_350,&local_248);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  std::__cxx11::string::string((string *)&local_288,"y",&local_35c);
  local_358 = translateY((this->origin).y,layout);
  std::__cxx11::string::string((string *)&local_2a8,"",&local_35d);
  attribute<double>(&local_268,&local_288,&local_358,&local_2a8);
  poVar1 = std::operator<<(poVar1,(string *)&local_268);
  Fill::toString_abi_cxx11_(&local_2c8,&(this->super_Shape).fill,layout);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c8);
  Stroke::toString_abi_cxx11_(&local_2e8,&(this->super_Shape).stroke,layout);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e8);
  Font::toString_abi_cxx11_(&local_308,&this->font,layout);
  poVar1 = std::operator<<(poVar1,(string *)&local_308);
  poVar1 = std::operator<<(poVar1,">");
  poVar1 = std::operator<<(poVar1,(string *)&this->content);
  std::__cxx11::string::string((string *)&local_348,"text",&local_35e);
  elemEnd(&local_328,&local_348);
  std::operator<<(poVar1,(string *)&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("text") << attribute("x", translateX(origin.x, layout))
                << attribute("y", translateY(origin.y, layout))
                << fill.toString(layout) << stroke.toString(layout) << font.toString(layout)
                << ">" << content << elemEnd("text");
            return ss.str();
        }